

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O0

int Lpk_NodeHasChanged(Lpk_Man_t *p,int iNode)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  int local_3c;
  int i;
  Abc_Obj_t *pTemp2;
  Abc_Obj_t *pTemp;
  Vec_Ptr_t *vNodes;
  int iNode_local;
  Lpk_Man_t *p_local;
  
  p_00 = Vec_VecEntry(p->vVisited,iNode);
  iVar1 = Vec_PtrSize(p_00);
  if (iVar1 == 0) {
    p_local._4_4_ = 1;
  }
  else {
    for (local_3c = 0; iVar1 = Vec_PtrSize(p_00), local_3c + 1 < iVar1; local_3c = local_3c + 2) {
      pvVar2 = Vec_PtrEntry(p_00,local_3c);
      Vec_PtrEntry(p_00,local_3c + 1);
      pAVar3 = Abc_NtkObj(p->pNtk,(int)pvVar2);
      if (pAVar3 == (Abc_Obj_t *)0x0) {
        return 1;
      }
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Lpk_NodeHasChanged( Lpk_Man_t * p, int iNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pTemp, * pTemp2;
    int i;
    vNodes = Vec_VecEntry( p->vVisited, iNode );
    if ( Vec_PtrSize(vNodes) == 0 )
        return 1;
    Vec_PtrForEachEntryDouble( Abc_Obj_t *, Abc_Obj_t *, vNodes, pTemp, pTemp2, i )
    {
        // check if the node has changed
        pTemp = Abc_NtkObj( p->pNtk, (int)(ABC_PTRUINT_T)pTemp );
        if ( pTemp == NULL )
            return 1;
        // check if the number of fanouts has changed
//        if ( Abc_ObjFanoutNum(pTemp) != (int)Vec_PtrEntry(vNodes, i+1) )
//            return 1;
//        i++;
    }
    return 0;
}